

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O0

void handle_accept(cio_server_socket *server_socket,void *handler_context,cio_error err,
                  cio_socket *socket)

{
  cio_error cVar1;
  cio_io_stream *stream_00;
  cio_io_stream *stream;
  echo_client *client;
  cio_socket *socket_local;
  cio_error err_local;
  void *handler_context_local;
  cio_server_socket *server_socket_local;
  
  if (err == CIO_SUCCESS) {
    stream_00 = cio_socket_get_io_stream(socket);
    cVar1 = cio_buffered_stream_init
                      ((cio_buffered_stream *)&socket[-1].stream.write_handler,stream_00);
    if (cVar1 == CIO_SUCCESS) {
      (*stream_00->read_some)
                (stream_00,(cio_read_buffer *)&socket[1].stream.write_handler_context,handle_read,
                 &socket[-1].stream.write_buffer);
    }
    else {
      fprintf(_stderr,"could not init buffered stream!\n");
      cio_server_socket_close(server_socket);
      cio_eventloop_cancel((server_socket->impl).loop);
    }
  }
  else {
    fprintf(_stderr,"accept error!\n");
    cio_server_socket_close(server_socket);
    cio_eventloop_cancel((server_socket->impl).loop);
  }
  return;
}

Assistant:

static void handle_accept(struct cio_server_socket *server_socket, void *handler_context, enum cio_error err, struct cio_socket *socket)
{
	(void)handler_context;

	struct echo_client *client = cio_container_of(socket, struct echo_client, socket);

	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "accept error!\n");
		cio_server_socket_close(server_socket);
		cio_eventloop_cancel(server_socket->impl.loop);
		return;
	}

	struct cio_io_stream *stream = cio_socket_get_io_stream(socket);
	err = cio_buffered_stream_init(&client->buffered_stream, stream);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "could not init buffered stream!\n");
		cio_server_socket_close(server_socket);
		cio_eventloop_cancel(server_socket->impl.loop);
		return;
	}

	stream->read_some(stream, &client->rb, handle_read, client);
}